

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O0

void __thiscall
xs::ExecutionRequestHandler::processMessage
          (ExecutionRequestHandler *this,MessageType type,deUint8 *data,size_t dataSize)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *name;
  char *params;
  char *workingDir;
  char *caseList;
  TestDriver *pTVar5;
  ProtocolError *pPVar6;
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [8];
  StopExecutionMessage msg_4;
  undefined1 local_140 [8];
  ExecuteBinaryMessage msg_3;
  KeepAliveMessage msg_2;
  TestMessage msg_1;
  string local_68;
  undefined1 local_38 [8];
  HelloMessage msg;
  size_t dataSize_local;
  deUint8 *data_local;
  MessageType type_local;
  ExecutionRequestHandler *this_local;
  
  msg.super_Message._8_8_ = dataSize;
  switch(type) {
  case MESSAGETYPE_HELLO:
    HelloMessage::HelloMessage((HelloMessage *)local_38,data,dataSize);
    printf("HelloMessage: version = %d\n",(ulong)msg.super_Message._vptr_Message._4_4_);
    if (msg.super_Message._vptr_Message._4_4_ != 0x12) {
      msg_1.test.field_2._M_local_buf[0xe] = '\x01';
      pPVar6 = (ProtocolError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Unsupported protocol version",
                 (allocator<char> *)(msg_1.test.field_2._M_local_buf + 0xf));
      ProtocolError::ProtocolError(pPVar6,&local_68);
      msg_1.test.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pPVar6,&ProtocolError::typeinfo,ProtocolError::~ProtocolError);
    }
    HelloMessage::~HelloMessage((HelloMessage *)local_38);
    break;
  case MESSAGETYPE_TEST:
    TestMessage::TestMessage((TestMessage *)&msg_2.super_Message.type,data,dataSize);
    uVar1 = std::__cxx11::string::c_str();
    printf("TestMessage: \'%s\'\n",uVar1);
    TestMessage::~TestMessage((TestMessage *)&msg_2.super_Message.type);
    break;
  case MESSAGETYPE_KEEPALIVE:
    SimpleMessage<102>::SimpleMessage
              ((SimpleMessage<102> *)((long)&msg_3.caseList.field_2 + 8),data,dataSize);
    printf("KeepAliveMessage\n");
    keepAliveReceived(this);
    SimpleMessage<102>::~SimpleMessage((SimpleMessage<102> *)((long)&msg_3.caseList.field_2 + 8));
    break;
  default:
    pPVar6 = (ProtocolError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"Unsupported message",&local_191);
    ProtocolError::ProtocolError(pPVar6,&local_190);
    __cxa_throw(pPVar6,&ProtocolError::typeinfo,ProtocolError::~ProtocolError);
  case MESSAGETYPE_EXECUTE_BINARY:
    ExecuteBinaryMessage::ExecuteBinaryMessage((ExecuteBinaryMessage *)local_140,data,dataSize);
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    std::__cxx11::string::substr
              ((ulong)&msg_4.super_Message.type,(ulong)((long)&msg_3.workDir.field_2 + 8));
    uVar4 = std::__cxx11::string::c_str();
    printf("ExecuteBinaryMessage: \'%s\', \'%s\', \'%s\', \'%s\'\n",uVar1,uVar2,uVar3,uVar4);
    std::__cxx11::string::~string((string *)&msg_4.super_Message.type);
    pTVar5 = getTestDriver(this);
    name = (char *)std::__cxx11::string::c_str();
    params = (char *)std::__cxx11::string::c_str();
    workingDir = (char *)std::__cxx11::string::c_str();
    caseList = (char *)std::__cxx11::string::c_str();
    TestDriver::startProcess(pTVar5,name,params,workingDir,caseList);
    keepAliveReceived(this);
    ExecuteBinaryMessage::~ExecuteBinaryMessage((ExecuteBinaryMessage *)local_140);
    break;
  case MESSAGETYPE_STOP_EXECUTION:
    SimpleMessage<112>::SimpleMessage((SimpleMessage<112> *)local_170,data,dataSize);
    printf("StopExecutionMessage\n");
    pTVar5 = getTestDriver(this);
    TestDriver::stopProcess(pTVar5);
    SimpleMessage<112>::~SimpleMessage((SimpleMessage<112> *)local_170);
  }
  return;
}

Assistant:

void ExecutionRequestHandler::processMessage (MessageType type, const deUint8* data, size_t dataSize)
{
	switch (type)
	{
		case MESSAGETYPE_HELLO:
		{
			HelloMessage msg(data, dataSize);
			DBG_PRINT(("HelloMessage: version = %d\n", msg.version));
			if (msg.version != PROTOCOL_VERSION)
				throw ProtocolError("Unsupported protocol version");
			break;
		}

		case MESSAGETYPE_TEST:
		{
			TestMessage msg(data, dataSize);
			DBG_PRINT(("TestMessage: '%s'\n", msg.test.c_str()));
			break;
		}

		case MESSAGETYPE_KEEPALIVE:
		{
			KeepAliveMessage msg(data, dataSize);
			DBG_PRINT(("KeepAliveMessage\n"));
			keepAliveReceived();
			break;
		}

		case MESSAGETYPE_EXECUTE_BINARY:
		{
			ExecuteBinaryMessage msg(data, dataSize);
			DBG_PRINT(("ExecuteBinaryMessage: '%s', '%s', '%s', '%s'\n", msg.name.c_str(), msg.params.c_str(), msg.workDir.c_str(), msg.caseList.substr(0, 10).c_str()));
			getTestDriver()->startProcess(msg.name.c_str(), msg.params.c_str(), msg.workDir.c_str(), msg.caseList.c_str());
			keepAliveReceived(); // \todo [2011-10-11 pyry] Remove this once Candy is fixed.
			break;
		}

		case MESSAGETYPE_STOP_EXECUTION:
		{
			StopExecutionMessage msg(data, dataSize);
			DBG_PRINT(("StopExecutionMessage\n"));
			getTestDriver()->stopProcess();
			break;
		}

		default:
			throw ProtocolError("Unsupported message");
	}
}